

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5StorageLoadTotals(Fts5Storage *p,int bCache)

{
  undefined4 in_ESI;
  long in_RDI;
  i64 *unaff_retaddr;
  int rc;
  undefined4 local_10;
  
  local_10 = 0;
  if (*(int *)(in_RDI + 0x10) == 0) {
    local_10 = sqlite3Fts5IndexGetAverages((Fts5Index *)p,(i64 *)CONCAT44(bCache,rc),unaff_retaddr);
    *(undefined4 *)(in_RDI + 0x10) = in_ESI;
  }
  return local_10;
}

Assistant:

static int fts5StorageLoadTotals(Fts5Storage *p, int bCache){
  int rc = SQLITE_OK;
  if( p->bTotalsValid==0 ){
    rc = sqlite3Fts5IndexGetAverages(p->pIndex, &p->nTotalRow, p->aTotalSize);
    p->bTotalsValid = bCache;
  }
  return rc;
}